

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::TanH_x86_avx::forward_inplace(TanH_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  long lVar6;
  float *pfVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar16 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  
  iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar12 = 0;
  uVar11 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar11 = uVar12;
  }
  auVar38 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
  for (; uVar12 != uVar11; uVar12 = uVar12 + 1) {
    pvVar1 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    pfVar7 = (float *)(sVar3 * uVar12 * sVar2 + (long)pvVar1);
    lVar10 = 0;
    for (iVar9 = 0; auVar37 = auVar38._0_16_, iVar9 + 7 < iVar8; iVar9 = iVar9 + 8) {
      auVar5._4_4_ = pfVar7[1] * -2.0;
      auVar5._0_4_ = *pfVar7 * -2.0;
      auVar5._8_4_ = pfVar7[2] * -2.0;
      auVar5._12_4_ = pfVar7[3] * -2.0;
      auVar5._16_4_ = pfVar7[4] * -2.0;
      auVar5._20_4_ = pfVar7[5] * -2.0;
      auVar5._24_4_ = pfVar7[6] * -2.0;
      auVar5._28_4_ = 0xc0000000;
      auVar28._8_4_ = 0x42b0c0a5;
      auVar28._0_8_ = 0x42b0c0a542b0c0a5;
      auVar28._12_4_ = 0x42b0c0a5;
      auVar28._16_4_ = 0x42b0c0a5;
      auVar28._20_4_ = 0x42b0c0a5;
      auVar28._24_4_ = 0x42b0c0a5;
      auVar28._28_4_ = 0x42b0c0a5;
      auVar5 = vminps_avx(auVar5,auVar28);
      auVar29._8_4_ = 0xc2b0c0a5;
      auVar29._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar29._12_4_ = 0xc2b0c0a5;
      auVar29._16_4_ = 0xc2b0c0a5;
      auVar29._20_4_ = 0xc2b0c0a5;
      auVar29._24_4_ = 0xc2b0c0a5;
      auVar29._28_4_ = 0xc2b0c0a5;
      auVar4 = vmaxps_avx(auVar5,auVar29);
      auVar30._0_4_ = auVar4._0_4_ * 1.442695 + 0.5;
      auVar30._4_4_ = auVar4._4_4_ * 1.442695 + 0.5;
      auVar30._8_4_ = auVar4._8_4_ * 1.442695 + 0.5;
      auVar30._12_4_ = auVar4._12_4_ * 1.442695 + 0.5;
      auVar30._16_4_ = auVar4._16_4_ * 1.442695 + 0.5;
      auVar30._20_4_ = auVar4._20_4_ * 1.442695 + 0.5;
      auVar30._24_4_ = auVar4._24_4_ * 1.442695 + 0.5;
      auVar30._28_4_ = 0x3ff8aa3b;
      auVar16 = vroundps_avx(auVar30,1);
      auVar5 = vcmpps_avx(auVar30,auVar16,1);
      auVar36._8_4_ = 0x3f800000;
      auVar36._0_8_ = 0x3f8000003f800000;
      auVar36._12_4_ = 0x3f800000;
      auVar36._16_4_ = 0x3f800000;
      auVar36._20_4_ = 0x3f800000;
      auVar36._24_4_ = 0x3f800000;
      auVar36._28_4_ = 0x3f800000;
      auVar5 = vandps_avx(auVar5,auVar36);
      auVar5 = vsubps_avx(auVar16,auVar5);
      fVar13 = auVar4._0_4_ + auVar5._0_4_ * -0.6931472;
      fVar17 = auVar4._4_4_ + auVar5._4_4_ * -0.6931472;
      fVar18 = auVar4._8_4_ + auVar5._8_4_ * -0.6931472;
      fVar19 = auVar4._12_4_ + auVar5._12_4_ * -0.6931472;
      fVar20 = auVar4._16_4_ + auVar5._16_4_ * -0.6931472;
      fVar21 = auVar4._20_4_ + auVar5._20_4_ * -0.6931472;
      fVar22 = auVar4._24_4_ + auVar5._24_4_ * -0.6931472;
      auVar23._0_4_ = (int)auVar5._0_4_;
      auVar23._4_4_ = (int)auVar5._4_4_;
      auVar23._8_4_ = (int)auVar5._8_4_;
      auVar23._12_4_ = (int)auVar5._12_4_;
      auVar31._16_4_ = (int)auVar5._16_4_;
      auVar31._0_16_ = auVar23;
      auVar31._20_4_ = (int)auVar5._20_4_;
      auVar31._24_4_ = (int)auVar5._24_4_;
      auVar31._28_4_ = (int)auVar5._28_4_;
      auVar32 = vpslld_avx(auVar23,0x17);
      auVar23 = vpslld_avx(auVar31._16_16_,0x17);
      auVar23 = vpaddd_avx(auVar23,auVar37);
      auVar37 = vpaddd_avx(auVar32,auVar37);
      auVar16._0_4_ =
           (fVar13 + 1.0 +
           fVar13 * fVar13 *
           (((((fVar13 * 0.00019875691 + 0.0013981999) * fVar13 + 0.008333452) * fVar13 +
             0.041665796) * fVar13 + 0.16666666) * fVar13 + 0.5)) * auVar37._0_4_ + 1.0;
      auVar16._4_4_ =
           (fVar17 + 1.0 +
           fVar17 * fVar17 *
           (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
             0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5)) * auVar37._4_4_ + 1.0;
      auVar16._8_4_ =
           (fVar18 + 1.0 +
           fVar18 * fVar18 *
           (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
             0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5)) * auVar37._8_4_ + 1.0;
      auVar16._12_4_ =
           (fVar19 + 1.0 +
           fVar19 * fVar19 *
           (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
             0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5)) * auVar37._12_4_ + 1.0;
      auVar16._16_4_ =
           (fVar20 + 1.0 +
           fVar20 * fVar20 *
           (((((fVar20 * 0.00019875691 + 0.0013981999) * fVar20 + 0.008333452) * fVar20 +
             0.041665796) * fVar20 + 0.16666666) * fVar20 + 0.5)) * auVar23._0_4_ + 1.0;
      auVar16._20_4_ =
           (fVar21 + 1.0 +
           fVar21 * fVar21 *
           (((((fVar21 * 0.00019875691 + 0.0013981999) * fVar21 + 0.008333452) * fVar21 +
             0.041665796) * fVar21 + 0.16666666) * fVar21 + 0.5)) * auVar23._4_4_ + 1.0;
      auVar16._24_4_ =
           (fVar22 + 1.0 +
           fVar22 * fVar22 *
           (((((fVar22 * 0.00019875691 + 0.0013981999) * fVar22 + 0.008333452) * fVar22 +
             0.041665796) * fVar22 + 0.16666666) * fVar22 + 0.5)) * auVar23._8_4_ + 1.0;
      auVar16._28_4_ = auVar4._28_4_ + -0.6931472 + 1.0 + -0.6931472 + 1.0;
      auVar5 = vrcpps_avx(auVar16);
      fVar13 = auVar5._0_4_;
      fVar17 = auVar5._4_4_;
      fVar18 = auVar5._8_4_;
      fVar19 = auVar5._12_4_;
      fVar20 = auVar5._16_4_;
      fVar21 = auVar5._20_4_;
      fVar22 = auVar5._24_4_;
      auVar4._4_4_ = auVar16._4_4_ * (fVar17 + fVar17);
      auVar4._0_4_ = auVar16._0_4_ * (fVar13 + fVar13);
      auVar4._8_4_ = auVar16._8_4_ * (fVar18 + fVar18);
      auVar4._12_4_ = auVar16._12_4_ * (fVar19 + fVar19);
      auVar4._16_4_ = auVar16._16_4_ * (fVar20 + fVar20);
      auVar4._20_4_ = auVar16._20_4_ * (fVar21 + fVar21);
      auVar4._24_4_ = auVar16._24_4_ * (fVar22 + fVar22);
      auVar4._28_4_ = auVar16._28_4_;
      auVar35._8_4_ = 0x40000000;
      auVar35._0_8_ = 0x4000000040000000;
      auVar35._12_4_ = 0x40000000;
      auVar35._16_4_ = 0x40000000;
      auVar35._20_4_ = 0x40000000;
      auVar35._24_4_ = 0x40000000;
      auVar35._28_4_ = 0x40000000;
      auVar4 = vsubps_avx(auVar35,auVar4);
      *pfVar7 = fVar13 + fVar13 + -1.0 + fVar13 * auVar4._0_4_;
      pfVar7[1] = fVar17 + fVar17 + -1.0 + fVar17 * auVar4._4_4_;
      pfVar7[2] = fVar18 + fVar18 + -1.0 + fVar18 * auVar4._8_4_;
      pfVar7[3] = fVar19 + fVar19 + -1.0 + fVar19 * auVar4._12_4_;
      pfVar7[4] = fVar20 + fVar20 + -1.0 + fVar20 * auVar4._16_4_;
      pfVar7[5] = fVar21 + fVar21 + -1.0 + fVar21 * auVar4._20_4_;
      pfVar7[6] = fVar22 + fVar22 + -1.0 + fVar22 * auVar4._24_4_;
      pfVar7[7] = auVar5._28_4_ + auVar5._28_4_ + -1.0 + auVar4._28_4_;
      pfVar7 = pfVar7 + 8;
      lVar10 = lVar10 + 8;
    }
    for (; iVar9 + 3 < iVar8; iVar9 = iVar9 + 4) {
      auVar32._0_4_ = *pfVar7 * -2.0;
      auVar32._4_4_ = pfVar7[1] * -2.0;
      auVar32._8_4_ = pfVar7[2] * -2.0;
      auVar32._12_4_ = pfVar7[3] * -2.0;
      auVar24._8_4_ = 0x42b0c0a5;
      auVar24._0_8_ = 0x42b0c0a542b0c0a5;
      auVar24._12_4_ = 0x42b0c0a5;
      auVar23 = vminps_avx(auVar32,auVar24);
      auVar25._8_4_ = 0xc2b0c0a5;
      auVar25._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar25._12_4_ = 0xc2b0c0a5;
      auVar14 = vmaxps_avx(auVar23,auVar25);
      auVar26._0_4_ = auVar14._0_4_ * 1.442695 + 0.5;
      auVar26._4_4_ = auVar14._4_4_ * 1.442695 + 0.5;
      auVar26._8_4_ = auVar14._8_4_ * 1.442695 + 0.5;
      auVar26._12_4_ = auVar14._12_4_ * 1.442695 + 0.5;
      auVar33._0_4_ = (int)auVar26._0_4_;
      auVar33._4_4_ = (int)auVar26._4_4_;
      auVar33._8_4_ = (int)auVar26._8_4_;
      auVar33._12_4_ = (int)auVar26._12_4_;
      auVar32 = vcvtdq2ps_avx(auVar33);
      auVar23 = vcmpps_avx(auVar26,auVar32,1);
      auVar23 = vandps_avx(auVar23,auVar37);
      auVar23 = vsubps_avx(auVar32,auVar23);
      fVar13 = auVar14._0_4_ + auVar23._0_4_ * -0.6931472;
      fVar17 = auVar14._4_4_ + auVar23._4_4_ * -0.6931472;
      fVar18 = auVar14._8_4_ + auVar23._8_4_ * -0.6931472;
      fVar19 = auVar14._12_4_ + auVar23._12_4_ * -0.6931472;
      auVar27._0_4_ = (int)auVar23._0_4_;
      auVar27._4_4_ = (int)auVar23._4_4_;
      auVar27._8_4_ = (int)auVar23._8_4_;
      auVar27._12_4_ = (int)auVar23._12_4_;
      auVar23 = vpslld_avx(auVar27,0x17);
      auVar23 = vpaddd_avx(auVar23,auVar37);
      auVar14._0_4_ =
           (fVar13 + auVar38._0_4_ +
           fVar13 * fVar13 *
           (((((fVar13 * 0.00019875691 + 0.0013981999) * fVar13 + 0.008333452) * fVar13 +
             0.041665796) * fVar13 + 0.16666666) * fVar13 + 0.5)) * auVar23._0_4_ + auVar38._0_4_;
      auVar14._4_4_ =
           (fVar17 + auVar38._4_4_ +
           fVar17 * fVar17 *
           (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
             0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5)) * auVar23._4_4_ + auVar38._4_4_;
      auVar14._8_4_ =
           (fVar18 + auVar38._8_4_ +
           fVar18 * fVar18 *
           (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
             0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5)) * auVar23._8_4_ + auVar38._8_4_;
      auVar14._12_4_ =
           (fVar19 + auVar38._12_4_ +
           fVar19 * fVar19 *
           (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
             0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5)) * auVar23._12_4_ + auVar38._12_4_;
      auVar23 = vrcpps_avx(auVar14);
      fVar13 = auVar23._0_4_;
      fVar17 = auVar23._4_4_;
      fVar18 = auVar23._8_4_;
      fVar19 = auVar23._12_4_;
      auVar15._0_4_ = auVar14._0_4_ * (fVar13 + fVar13);
      auVar15._4_4_ = auVar14._4_4_ * (fVar17 + fVar17);
      auVar15._8_4_ = auVar14._8_4_ * (fVar18 + fVar18);
      auVar15._12_4_ = auVar14._12_4_ * (fVar19 + fVar19);
      auVar34._8_4_ = 0x40000000;
      auVar34._0_8_ = 0x4000000040000000;
      auVar34._12_4_ = 0x40000000;
      auVar23 = vsubps_avx(auVar34,auVar15);
      *pfVar7 = fVar13 + fVar13 + -1.0 + fVar13 * auVar23._0_4_;
      pfVar7[1] = fVar17 + fVar17 + -1.0 + fVar17 * auVar23._4_4_;
      pfVar7[2] = fVar18 + fVar18 + -1.0 + fVar18 * auVar23._8_4_;
      pfVar7[3] = fVar19 + fVar19 + -1.0 + fVar19 * auVar23._12_4_;
      pfVar7 = pfVar7 + 4;
      lVar10 = lVar10 + 4;
    }
    lVar6 = sVar3 * sVar2 * uVar12;
    for (; (int)lVar10 < iVar8; lVar10 = lVar10 + 1) {
      fVar13 = tanhf(*(float *)((long)pvVar1 + lVar10 * 4 + lVar6));
      auVar38 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      *(float *)((long)pvVar1 + lVar10 * 4 + lVar6) = fVar13;
    }
  }
  return 0;
}

Assistant:

int TanH_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = tanh_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = tanh_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = tanh_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = tanhf(*ptr);
            ptr++;
        }
    }

    return 0;
}